

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_converter.cpp
# Opt level: O1

bool __thiscall dxil_spv::Converter::Impl::emit_hit_attribute(Impl *this)

{
  Value *this_00;
  TypeID TVar1;
  Id IVar2;
  Function *this_01;
  IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
  IVar3;
  IteratorAdaptor<const_LLVMBC::Argument,___gnu_cxx::__normal_iterator<LLVMBC::Argument_*const_*,_std::vector<LLVMBC::Argument_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Argument_*>_>_>_>
  IVar4;
  Type *pTVar5;
  mapped_type *pmVar6;
  bool bVar7;
  Value *local_28;
  
  this_01 = get_entry_point_function(this->entry_point_meta);
  IVar3 = LLVMBC::Function::arg_end(this_01);
  IVar4 = LLVMBC::Function::arg_begin(this_01);
  if ((long)IVar3.iter._M_current - (long)IVar4.iter._M_current < 9) {
    bVar7 = true;
    if ((this->execution_model == ExecutionModelIntersectionKHR) &&
       (this->llvm_hit_attribute_output_type != (Type *)0x0)) {
      pTVar5 = LLVMBC::Type::getPointerElementType(this->llvm_hit_attribute_output_type);
      IVar2 = get_type_id(this,pTVar5,0);
      IVar2 = SPIRVModule::create_variable
                        (this->spirv_module,StorageClassHitAttributeKHR,IVar2,"hit");
      this->llvm_hit_attribute_output_value = IVar2;
    }
  }
  else {
    IVar3 = LLVMBC::Function::arg_begin(this_01);
    this_00 = *(Value **)((long)IVar3.iter._M_current + 8);
    pTVar5 = LLVMBC::Value::getType(this_00);
    TVar1 = LLVMBC::Type::getTypeID(pTVar5);
    if (TVar1 == PointerTyID) {
      pTVar5 = LLVMBC::Value::getType(this_00);
      pTVar5 = LLVMBC::Type::getPointerElementType(pTVar5);
      IVar2 = get_type_id(this,pTVar5,0);
      IVar2 = SPIRVModule::create_variable
                        (this->spirv_module,StorageClassHitAttributeKHR,IVar2,"hit");
      local_28 = this_00;
      pmVar6 = std::__detail::
               _Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<const_LLVMBC::Value_*,_std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>,_dxil_spv::ThreadLocalAllocator<std::pair<const_LLVMBC::Value_*const,_spv::StorageClass>_>,_std::__detail::_Select1st,_std::equal_to<const_LLVMBC::Value_*>,_std::hash<const_LLVMBC::Value_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&this->handle_to_storage_class,&local_28);
      *pmVar6 = StorageClassHitAttributeKHR;
      rewrite_value(this,this_00,IVar2);
      bVar7 = true;
    }
    else {
      bVar7 = false;
    }
  }
  return bVar7;
}

Assistant:

bool Converter::Impl::emit_hit_attribute()
{
	auto *func = get_entry_point_function(entry_point_meta);

	// The second argument to a RT entry point is always a pointer to hit attribute.
	if (func->arg_end() - func->arg_begin() >= 2)
	{
		auto args = func->arg_begin();
		++args;
		auto &arg = *args;
		if (!llvm::isa<llvm::PointerType>(arg.getType()))
			return false;
		auto *elem_type = arg.getType()->getPointerElementType();

		spv::Id hit_attribute_var = create_variable(spv::StorageClassHitAttributeKHR, get_type_id(elem_type), "hit");
		handle_to_storage_class[&arg] = spv::StorageClassHitAttributeKHR;
		rewrite_value(&arg, hit_attribute_var);
	}
	else if (execution_model == spv::ExecutionModelIntersectionKHR && llvm_hit_attribute_output_type)
	{
		auto *elem_type = llvm_hit_attribute_output_type->getPointerElementType();
		llvm_hit_attribute_output_value = create_variable(spv::StorageClassHitAttributeKHR,
		                                                  get_type_id(elem_type), "hit");
	}

	return true;
}